

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O3

void __thiscall
ExampleNLFeeder::FeedRowAndObjNames<mp::StringFileWriter>
          (ExampleNLFeeder *this,StringFileWriter *wrt)

{
  bool bVar1;
  int i;
  long lVar2;
  
  if (wrt->fTriedOpen_ == false) {
    bVar1 = mp::StringFileWriter::Open(wrt);
    if (!bVar1) {
      return;
    }
  }
  else if ((wrt->nm).f_ == (FILE *)0x0) {
    return;
  }
  lVar2 = 0;
  do {
    mp::StringFileWriter::Write<char_const*>(wrt,this->mdl_->con_name[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  mp::StringFileWriter::Write<char_const*>(wrt,this->mdl_->obj_name);
  return;
}

Assistant:

void FeedRowAndObjNames(RowObjNameWriter& wrt) {
    if (wrt) {     // && output_desired
      for (int i=0; i<Model().n_con; ++i)
        wrt << Model().con_name[i];
      wrt << Model().obj_name;
    }
  }